

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

int Abs_GiaSortNodes(Gia_Man_t *p,Vec_Int_t *vSupp)

{
  int nSizeNew;
  int iVar1;
  int iVar2;
  int *__dest;
  int *piVar3;
  bool bVar4;
  int local_28;
  int RetValue;
  int i;
  int nSize;
  Gia_Obj_t *pObj;
  Vec_Int_t *vSupp_local;
  Gia_Man_t *p_local;
  
  nSizeNew = Vec_IntSize(vSupp);
  local_28 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vSupp);
    bVar4 = false;
    if (local_28 < iVar1) {
      iVar1 = Vec_IntEntry(vSupp,local_28);
      _i = Gia_ManObj(p,iVar1);
      bVar4 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    if (local_28 < nSizeNew) {
      iVar1 = Gia_ObjRefNum(p,_i);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsRo(p,_i);
        if (iVar1 == 0) {
          if ((*(ulong *)_i >> 0x3e & 1) == 0) {
            __assert_fail("pObj->fMark1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                          ,0x1b1,"int Abs_GiaSortNodes(Gia_Man_t *, Vec_Int_t *)");
          }
          iVar1 = Gia_ObjId(p,_i);
          Vec_IntPush(vSupp,iVar1);
        }
      }
    }
    local_28 = local_28 + 1;
  }
  iVar1 = Vec_IntSize(vSupp);
  local_28 = 0;
  do {
    iVar2 = Vec_IntSize(vSupp);
    bVar4 = false;
    if (local_28 < iVar2) {
      iVar2 = Vec_IntEntry(vSupp,local_28);
      _i = Gia_ManObj(p,iVar2);
      bVar4 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) {
      iVar2 = Vec_IntSize(vSupp);
      if (iVar2 == nSizeNew * 2) {
        __dest = Vec_IntArray(vSupp);
        piVar3 = Vec_IntArray(vSupp);
        memmove(__dest,piVar3 + nSizeNew,(long)nSizeNew << 2);
        Vec_IntShrink(vSupp,nSizeNew);
        return iVar1 - nSizeNew;
      }
      __assert_fail("Vec_IntSize(vSupp) == 2 * nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                    ,0x1b8,"int Abs_GiaSortNodes(Gia_Man_t *, Vec_Int_t *)");
    }
    if (local_28 < nSizeNew) {
      iVar2 = Gia_ObjRefNum(p,_i);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsRo(p,_i);
        if (iVar2 == 0) goto LAB_007ad9e1;
      }
      iVar2 = Gia_ObjId(p,_i);
      Vec_IntPush(vSupp,iVar2);
    }
LAB_007ad9e1:
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int Abs_GiaSortNodes( Gia_Man_t * p, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj;
    int nSize = Vec_IntSize(vSupp);
    int i, RetValue;
    Gia_ManForEachObjVec( vSupp, p, pObj, i )
        if ( i < nSize && Gia_ObjRefNum(p, pObj) == 0 && !Gia_ObjIsRo(p, pObj) ) // add removable leaves
        {
            assert( pObj->fMark1 );
            Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        }
    RetValue = Vec_IntSize(vSupp) - nSize;
    Gia_ManForEachObjVec( vSupp, p, pObj, i )
        if ( i < nSize && !(Gia_ObjRefNum(p, pObj) == 0 && !Gia_ObjIsRo(p, pObj)) ) // add non-removable leaves
            Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
    assert( Vec_IntSize(vSupp) == 2 * nSize );
    memmove( Vec_IntArray(vSupp), Vec_IntArray(vSupp) + nSize, sizeof(int) * nSize );
    Vec_IntShrink( vSupp, nSize );
    return RetValue;
}